

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Importer.cpp
# Opt level: O2

size_t __thiscall Assimp::Importer::GetImporterIndex(Importer *this,char *szExtension)

{
  _Rb_tree_header *p_Var1;
  char cVar2;
  __type _Var3;
  ImporterPimpl *pIVar4;
  _Base_ptr p_Var5;
  size_type sVar6;
  char cVar7;
  pointer ppBVar8;
  size_t sStack_90;
  string ext;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  str;
  
  if (this->pimpl == (ImporterPimpl *)0x0) {
    __assert_fail("nullptr != pimpl",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/Common/Importer.cpp"
                  ,0x3b9,"size_t Assimp::Importer::GetImporterIndex(const char *) const");
  }
  if (szExtension == (char *)0x0) {
    __assert_fail("nullptr != szExtension",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/Common/Importer.cpp"
                  ,0x3ba,"size_t Assimp::Importer::GetImporterIndex(const char *) const");
  }
  for (; (byte)(*szExtension | 4U) == 0x2e; szExtension = (char *)((byte *)szExtension + 1)) {
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&ext,szExtension,(allocator<char> *)&str);
  if (ext._M_string_length == 0) {
    sStack_90 = 0xffffffffffffffff;
  }
  else {
    for (sVar6 = 0; ext._M_string_length != sVar6; sVar6 = sVar6 + 1) {
      cVar2 = ext._M_dataplus._M_p[sVar6];
      cVar7 = cVar2 + ' ';
      if (0x19 < (byte)(cVar2 + 0xbfU)) {
        cVar7 = cVar2;
      }
      ext._M_dataplus._M_p[sVar6] = cVar7;
    }
    p_Var1 = &str._M_t._M_impl.super__Rb_tree_header;
    str._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    str._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    str._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    pIVar4 = this->pimpl;
    ppBVar8 = (pIVar4->mImporter).
              super__Vector_base<Assimp::BaseImporter_*,_std::allocator<Assimp::BaseImporter_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    str._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
    str._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
    for (; ppBVar8 !=
           (pIVar4->mImporter).
           super__Vector_base<Assimp::BaseImporter_*,_std::allocator<Assimp::BaseImporter_*>_>.
           _M_impl.super__Vector_impl_data._M_finish; ppBVar8 = ppBVar8 + 1) {
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::clear(&str._M_t);
      BaseImporter::GetExtensionList
                (*ppBVar8,(set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&str._M_t);
      for (p_Var5 = str._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var5 != p_Var1; p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5))
      {
        _Var3 = std::operator==(&ext,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)(p_Var5 + 1));
        if (_Var3) {
          sStack_90 = (long)ppBVar8 -
                      (long)(this->pimpl->mImporter).
                            super__Vector_base<Assimp::BaseImporter_*,_std::allocator<Assimp::BaseImporter_*>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 3;
          goto LAB_0030f2ee;
        }
      }
      pIVar4 = this->pimpl;
    }
    sStack_90 = 0xffffffffffffffff;
LAB_0030f2ee:
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree(&str._M_t);
  }
  std::__cxx11::string::~string((string *)&ext);
  return sStack_90;
}

Assistant:

size_t Importer::GetImporterIndex (const char* szExtension) const {
    ai_assert(nullptr != pimpl);
    ai_assert(nullptr != szExtension);

    ASSIMP_BEGIN_EXCEPTION_REGION();

    // skip over wildcard and dot characters at string head --
    for ( ; *szExtension == '*' || *szExtension == '.'; ++szExtension );

    std::string ext(szExtension);
    if (ext.empty()) {
        return static_cast<size_t>(-1);
    }
    std::transform( ext.begin(), ext.end(), ext.begin(), ToLower<char> );

    std::set<std::string> str;
    for (std::vector<BaseImporter*>::const_iterator i =  pimpl->mImporter.begin();i != pimpl->mImporter.end();++i)  {
        str.clear();

        (*i)->GetExtensionList(str);
        for (std::set<std::string>::const_iterator it = str.begin(); it != str.end(); ++it) {
            if (ext == *it) {
                return std::distance(static_cast< std::vector<BaseImporter*>::const_iterator >(pimpl->mImporter.begin()), i);
            }
        }
    }
    ASSIMP_END_EXCEPTION_REGION(size_t);
    return static_cast<size_t>(-1);
}